

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::multiplyRep(string *unit_string,size_t loc,size_t sz)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  value_type tchar2;
  value_type tchar;
  size_t sz_local;
  size_t loc_local;
  string *unit_string_local;
  
  if (loc == 0) {
    std::__cxx11::string::erase((ulong)unit_string,0);
  }
  else {
    uVar3 = std::__cxx11::string::size();
    if (loc + sz < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      cVar1 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      cVar2 = *pcVar4;
      if ((((cVar1 == '*') || (cVar1 == '/')) || (cVar1 == '^')) ||
         (((cVar2 == '*' || (cVar2 == '/')) || (cVar2 == '^')))) {
        if ((((cVar1 == '*') || (cVar1 == '/')) || (cVar1 == '^')) &&
           (((cVar2 == '*' || (cVar2 == '/')) || (cVar2 == '^')))) {
          std::__cxx11::string::erase((ulong)unit_string,loc - 1);
        }
        else {
          std::__cxx11::string::erase((ulong)unit_string,loc);
        }
      }
      else {
        std::__cxx11::string::replace((ulong)unit_string,loc,(char *)sz);
      }
    }
    else {
      std::__cxx11::string::erase((ulong)unit_string,loc);
      pcVar4 = (char *)std::__cxx11::string::back();
      if (((*pcVar4 == '^') || (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '*')) ||
         (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '/')) {
        std::__cxx11::string::pop_back();
      }
    }
  }
  return;
}

Assistant:

static void multiplyRep(std::string& unit_string, size_t loc, size_t sz)
{
    if (loc == 0) {
        unit_string.erase(0, sz);
        return;
    }
    if (unit_string.size() <= loc + sz) {
        unit_string.erase(loc, sz);
        if (unit_string.back() == '^' || unit_string.back() == '*' ||
            unit_string.back() == '/') {
            unit_string.pop_back();
        }
        return;
    }
    auto tchar = unit_string[loc - 1];
    auto tchar2 = unit_string[loc + sz];
    if (tchar == '*' || tchar == '/' || tchar == '^' || tchar2 == '*' ||
        tchar2 == '/' || tchar2 == '^') {
        if ((tchar == '*' || tchar == '/' || tchar == '^') &&
            (tchar2 == '*' || tchar2 == '/' || tchar2 == '^')) {
            unit_string.erase(loc - 1, sz + 1);
        } else {
            unit_string.erase(loc, sz);
        }
    } else {
        unit_string.replace(loc, sz, "*");
    }
}